

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t bitset_set_list_withcard(uint64_t *words,uint64_t card,uint16_t *list,uint64_t length)

{
  _Bool _Var1;
  uint64_t length_local;
  uint16_t *list_local;
  uint64_t card_local;
  uint64_t *words_local;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    words_local = (uint64_t *)_asm_bitset_set_list_withcard(words,card,list,length);
  }
  else {
    words_local = (uint64_t *)_scalar_bitset_set_list_withcard(words,card,list,length);
  }
  return (uint64_t)words_local;
}

Assistant:

uint64_t bitset_set_list_withcard(uint64_t *words, uint64_t card,
                                  const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        return _asm_bitset_set_list_withcard(words, card, list, length);
    } else {
        return _scalar_bitset_set_list_withcard(words, card, list, length);
    }
}